

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brkeng.cpp
# Opt level: O3

LanguageBreakEngine * __thiscall
icu_63::ICULanguageBreakFactory::getEngineFor(ICULanguageBreakFactory *this,UChar32 c)

{
  uint in_EAX;
  int iVar1;
  LanguageBreakEngine *obj;
  UStack *this_00;
  undefined4 extraout_var;
  undefined4 in_register_00000034;
  size_t size;
  uint uVar2;
  UErrorCode status;
  undefined8 uStack_28;
  
  size = CONCAT44(in_register_00000034,c);
  uStack_28 = (ulong)in_EAX;
  umtx_lock_63((UMutex *)gBreakEngineMutex);
  if (this->fEngines == (UStack *)0x0) {
    this_00 = (UStack *)UMemory::operator_new((UMemory *)0x28,size);
    if (this_00 != (UStack *)0x0) {
      UStack::UStack(this_00,_deleteEngine,(UElementsAreEqual *)0x0,
                     (UErrorCode *)((long)&uStack_28 + 4));
      if (uStack_28._4_4_ < 1) {
        this->fEngines = this_00;
        goto LAB_00385a9c;
      }
      (*(this_00->super_UVector).super_UObject._vptr_UObject[1])(this_00);
    }
  }
  else {
    iVar1 = (this->fEngines->super_UVector).count;
    if (0 < iVar1) {
      uVar2 = iVar1 + 1;
      do {
        obj = (LanguageBreakEngine *)UVector::elementAt(&this->fEngines->super_UVector,uVar2 - 2);
        if ((obj != (LanguageBreakEngine *)0x0) &&
           (iVar1 = (*obj->_vptr_LanguageBreakEngine[2])(obj,c), (char)iVar1 != '\0'))
        goto LAB_00385ac5;
        uVar2 = uVar2 - 1;
      } while (1 < uVar2);
    }
LAB_00385a9c:
    iVar1 = (*(this->super_LanguageBreakFactory)._vptr_LanguageBreakFactory[3])(this,c);
    obj = (LanguageBreakEngine *)CONCAT44(extraout_var,iVar1);
    if (obj != (LanguageBreakEngine *)0x0) {
      UVector::addElement(&this->fEngines->super_UVector,obj,(UErrorCode *)((long)&uStack_28 + 4));
      goto LAB_00385ac5;
    }
  }
  obj = (LanguageBreakEngine *)0x0;
LAB_00385ac5:
  umtx_unlock_63((UMutex *)gBreakEngineMutex);
  return obj;
}

Assistant:

const LanguageBreakEngine *
ICULanguageBreakFactory::getEngineFor(UChar32 c) {
    const LanguageBreakEngine *lbe = NULL;
    UErrorCode  status = U_ZERO_ERROR;

    Mutex m(&gBreakEngineMutex);

    if (fEngines == NULL) {
        UStack  *engines = new UStack(_deleteEngine, NULL, status);
        if (U_FAILURE(status) || engines == NULL) {
            // Note: no way to return error code to caller.
            delete engines;
            return NULL;
        }
        fEngines = engines;
    } else {
        int32_t i = fEngines->size();
        while (--i >= 0) {
            lbe = (const LanguageBreakEngine *)(fEngines->elementAt(i));
            if (lbe != NULL && lbe->handles(c)) {
                return lbe;
            }
        }
    }
    
    // We didn't find an engine. Create one.
    lbe = loadEngineFor(c);
    if (lbe != NULL) {
        fEngines->push((void *)lbe, status);
    }
    return lbe;
}